

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O1

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t *self)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (self->table[uVar2] != (cf_hashtbl_iter_t)0x0) {
      return self->table[uVar2];
    }
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
  } while (uVar1 <= self->hashmsk);
  return (cf_hashtbl_iter_t)0x0;
}

Assistant:

cf_hashtbl_iter_t cf_hashtbl_iter_init(cf_hashtbl_t* self) {
    cf_uint32_t i;
    /* find the first table index */
    for (i = 0; i <= self->hashmsk; i++) {
        if (self->table[i]) {
            return self->table[i];
        }
    }
    return CF_NULL_PTR;
}